

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quasiquote_conversion.cpp
# Opt level: O0

cell * __thiscall
skiwi::anon_unknown_26::quasiquote_conversion_visitor::tag_data
          (cell *__return_storage_ptr__,quasiquote_conversion_visitor *this,cell *c)

{
  bool bVar1;
  ulong uVar2;
  const_reference pvVar3;
  bool local_21;
  cell *c_local;
  quasiquote_conversion_visitor *this_local;
  
  bVar1 = tag_is_backquote(this,c);
  local_21 = true;
  if (!bVar1) {
    bVar1 = tag_is_comma(this,c);
    local_21 = true;
    if (!bVar1) {
      local_21 = tag_is_comma_atsign(this,c);
    }
  }
  if (local_21 == false) {
    __assert_fail("tag_is_backquote(c) || tag_is_comma(c) || tag_is_comma_atsign(c)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/quasiquote_conversion.cpp"
                  ,0x41,
                  "cell skiwi::(anonymous namespace)::quasiquote_conversion_visitor::tag_data(const cell &)"
                 );
  }
  std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::operator[](&c->pair,0);
  uVar2 = std::__cxx11::string::length();
  if (uVar2 < 4) {
    pvVar3 = std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::operator[](&c->pair,1);
    cell::cell(__return_storage_ptr__,pvVar3);
  }
  else {
    pvVar3 = std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::operator[](&c->pair,1);
    pvVar3 = std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::operator[](&pvVar3->pair,1);
    bVar1 = skiwi::operator==(pvVar3,(cell *)skiwi::nil_sym);
    if (!bVar1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/quasiquote_conversion.cpp"
                    ,0x47,
                    "cell skiwi::(anonymous namespace)::quasiquote_conversion_visitor::tag_data(const cell &)"
                   );
    }
    pvVar3 = std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::operator[](&c->pair,1);
    pvVar3 = std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::operator[](&pvVar3->pair,0);
    cell::cell(__return_storage_ptr__,pvVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

cell tag_data(const cell& c)
      {
      assert(tag_is_backquote(c) || tag_is_comma(c) || tag_is_comma_atsign(c));
      if (c.pair[0].value.length() > 3) // quasiquote, unquote, or unquote-splicing
        {
        if (c.pair[1].pair[1] == nil_sym)
          return c.pair[1].pair[0];
        else
          assert(0);
        }
      return c.pair[1];
      }